

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_map_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSAtom prop;
  JSContext *ctx_00;
  int iVar1;
  uint *puVar2;
  void *pvVar3;
  JSValueUnion JVar5;
  ulong uVar6;
  ulong uVar7;
  int64_t iVar8;
  JSValue v;
  JSValue JVar9;
  JSValue val;
  JSValue JVar10;
  JSValue JVar11;
  JSValue v_00;
  JSValue JVar12;
  ulong in_stack_ffffffffffffff28;
  JSValue *argv_00;
  BOOL *in_stack_ffffffffffffff30;
  JSValueUnion local_b8;
  int64_t local_b0;
  JSValueUnion local_90;
  JSValue local_88;
  int64_t local_78;
  JSContext *local_70;
  int64_t local_68;
  BOOL done;
  JSValue local_58;
  JSValue local_48;
  JSValueUnion JVar4;
  
  JVar9 = js_create_from_ctor(ctx,new_target,magic + 0x1f);
  local_b0 = 6;
  if ((int)JVar9.tag == 6) {
    uVar7 = 0;
    uVar6 = 0;
    goto LAB_00129e04;
  }
  puVar2 = (uint *)js_mallocz(ctx,0x30);
  local_b8 = JVar9.u;
  local_b0 = JVar9.tag;
  local_70 = ctx;
  if (puVar2 == (uint *)0x0) {
    val = (JSValue)(ZEXT816(3) << 0x40);
    JVar10 = (JSValue)(ZEXT816(3) << 0x40);
    JVar11 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    *(uint **)(puVar2 + 2) = puVar2 + 2;
    *(uint **)(puVar2 + 4) = puVar2 + 2;
    *puVar2 = (uint)magic >> 1 & 1;
    if ((int)JVar9.tag == -1) {
      *(uint **)((long)local_b8.ptr + 0x30) = puVar2;
    }
    puVar2[10] = 1;
    pvVar3 = js_malloc(ctx,0x10);
    *(void **)(puVar2 + 8) = pvVar3;
    if (pvVar3 == (void *)0x0) {
      val = (JSValue)(ZEXT816(3) << 0x40);
      JVar10 = (JSValue)(ZEXT816(3) << 0x40);
      JVar11 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      *(void **)pvVar3 = pvVar3;
      *(void **)((long)pvVar3 + 8) = pvVar3;
      puVar2[0xb] = 4;
      if ((argc < 1) || (iVar8 = argv->tag, ((uint)iVar8 & 0xfffffffe) == 2)) {
LAB_00129c87:
        uVar6 = (ulong)local_b8.ptr & 0xffffffff00000000;
        uVar7 = (ulong)local_b8.ptr & 0xffffffff;
        goto LAB_00129e04;
      }
      JVar4 = (JSValueUnion)(argv->u).ptr;
      prop = 0x68;
      if ((magic & 1U) == 0) {
        prop = 0x42;
      }
      in_stack_ffffffffffffff28 = in_stack_ffffffffffffff28 & 0xffffffff00000000;
      val = JS_GetPropertyInternal(ctx,JVar9,prop,JVar9,0);
      if ((int)val.tag != 6) {
        iVar1 = JS_IsFunction(ctx,val);
        if (iVar1 != 0) {
          JVar11.tag = iVar8;
          JVar11.u = (JSValueUnion)(JSValueUnion)JVar4.ptr;
          JVar10 = JS_GetIterator(ctx,JVar11,0);
          JVar4 = JVar10.u;
          if ((int)JVar10.tag == 6) {
            JVar11 = (JSValue)(ZEXT816(3) << 0x40);
          }
          else {
            argv_00 = (JSValue *)(in_stack_ffffffffffffff28 & 0xffffffff00000000);
            JVar11 = JS_GetPropertyInternal(ctx,JVar10,0x6a,JVar10,0);
            iVar8 = JVar10.tag;
            if ((int)JVar11.tag != 6) {
              while( true ) {
                local_68 = iVar8;
                iVar8 = JVar10.tag;
                JVar5 = JVar10.u;
                local_88 = JS_IteratorNext(ctx,JVar10,JVar11,(int)&done,argv_00,
                                           in_stack_ffffffffffffff30);
                if ((local_88.tag & 0xffffffffU) == 6) break;
                if (done != 0) {
                  JS_FreeValue(ctx,local_88);
                  JS_FreeValue(ctx,JVar11);
                  JS_FreeValue(ctx,JVar10);
                  JS_FreeValue(ctx,val);
                  goto LAB_00129c87;
                }
                if ((magic & 1U) == 0) {
                  if ((int)local_88.tag == -1) {
                    JVar10 = JS_GetPropertyUint32(ctx,local_88,0);
                    JVar5 = JVar10.u;
                    if ((int)JVar10.tag == 6) {
                      uVar6 = (ulong)JVar5.ptr & 0xffffffff00000000;
                      uVar7 = 0;
                      v_00 = (JSValue)(ZEXT816(3) << 0x40);
                    }
                    else {
                      v_00 = JS_GetPropertyUint32(ctx,local_88,1);
                      if ((int)v_00.tag == 6) {
                        uVar6 = (ulong)JVar5.ptr & 0xffffffff00000000;
                        uVar7 = (ulong)v_00.u.ptr & 0xffffffff00000000;
                      }
                      else {
                        argv_00 = &local_58;
                        local_58 = JVar10;
                        local_48 = v_00;
                        JVar12 = JS_Call(ctx,val,JVar9,2,argv_00);
                        if ((int)JVar12.tag != 6) {
                          JS_FreeValue(ctx,JVar10);
                          JS_FreeValue(ctx,v_00);
                          JVar5 = JVar4;
                          goto LAB_00129fa9;
                        }
                        uVar6 = (ulong)JVar5.ptr & 0xffffffff00000000;
                        uVar7 = (ulong)v_00.u.ptr & 0xffffffff00000000;
                        iVar8 = local_68;
                      }
                    }
                  }
                  else {
                    JS_ThrowTypeErrorNotAnObject(ctx);
                    uVar6 = 0;
                    uVar7 = 0;
                    v_00 = (JSValue)(ZEXT816(3) << 0x40);
                    JVar10 = (JSValue)(ZEXT816(3) << 0x40);
                  }
                  local_90 = v_00.u;
                  local_78 = JVar10.tag;
                  JS_FreeValue(ctx,local_88);
                  JVar12.u.ptr = (void *)((ulong)JVar10.u.ptr & 0xffffffff | uVar6);
                  JVar12.tag = local_78;
                  JS_FreeValue(ctx,JVar12);
                  v.u.ptr = (void *)((ulong)local_90.ptr & 0xffffffff | uVar7);
                  v.tag = v_00.tag;
                  JS_FreeValue(ctx,v);
                  break;
                }
                argv_00 = &local_88;
                JVar12 = JS_Call(ctx,val,JVar9,1,argv_00);
                if ((int)JVar12.tag == 6) {
                  JS_FreeValue(ctx,local_88);
                  iVar8 = local_68;
                  break;
                }
LAB_00129fa9:
                JS_FreeValue(ctx,JVar12);
                JS_FreeValue(ctx,local_88);
                JVar10.tag = local_68;
                JVar10.u.ptr = JVar5.ptr;
                iVar8 = local_68;
              }
              JVar10.tag = iVar8;
              JVar10.u.ptr = JVar4.ptr;
            }
          }
          if ((int)JVar10.tag == -1) {
            JS_IteratorClose(local_70,JVar10,1);
          }
          goto LAB_00129dbe;
        }
        JS_ThrowTypeError(ctx,"set/add is not a function");
      }
      JVar10 = (JSValue)(ZEXT816(3) << 0x40);
      JVar11 = (JSValue)(ZEXT816(3) << 0x40);
    }
  }
LAB_00129dbe:
  ctx_00 = local_70;
  JS_FreeValue(local_70,JVar11);
  JS_FreeValue(ctx_00,JVar10);
  JS_FreeValue(ctx_00,val);
  JS_FreeValue(ctx_00,JVar9);
  uVar7 = 0;
  uVar6 = 0;
  local_b0 = 6;
LAB_00129e04:
  JVar9.u.ptr = (void *)(uVar7 | uVar6);
  JVar9.tag = local_b0;
  return JVar9;
}

Assistant:

static JSValue js_map_constructor(JSContext *ctx, JSValueConst new_target,
                                  int argc, JSValueConst *argv, int magic)
{
    JSMapState *s;
    JSValue obj, adder = JS_UNDEFINED, iter = JS_UNDEFINED, next_method = JS_UNDEFINED;
    JSValueConst arr;
    BOOL is_set, is_weak;

    is_set = magic & MAGIC_SET;
    is_weak = ((magic & MAGIC_WEAK) != 0);
    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_MAP + magic);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    init_list_head(&s->records);
    s->is_weak = is_weak;
    JS_SetOpaque(obj, s);
    s->hash_size = 1;
    s->hash_table = js_malloc(ctx, sizeof(s->hash_table[0]) * s->hash_size);
    if (!s->hash_table)
        goto fail;
    init_list_head(&s->hash_table[0]);
    s->record_count_threshold = 4;

    arr = JS_UNDEFINED;
    if (argc > 0)
        arr = argv[0];
    if (!JS_IsUndefined(arr) && !JS_IsNull(arr)) {
        JSValue item, ret;
        BOOL done;

        adder = JS_GetProperty(ctx, obj, is_set ? JS_ATOM_add : JS_ATOM_set);
        if (JS_IsException(adder))
            goto fail;
        if (!JS_IsFunction(ctx, adder)) {
            JS_ThrowTypeError(ctx, "set/add is not a function");
            goto fail;
        }

        iter = JS_GetIterator(ctx, arr, FALSE);
        if (JS_IsException(iter))
            goto fail;
        next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
        if (JS_IsException(next_method))
            goto fail;

        for(;;) {
            item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
            if (JS_IsException(item))
                goto fail;
            if (done) {
                JS_FreeValue(ctx, item);
                break;
            }
            if (is_set) {
                ret = JS_Call(ctx, adder, obj, 1, (JSValueConst *)&item);
                if (JS_IsException(ret)) {
                    JS_FreeValue(ctx, item);
                    goto fail;
                }
            } else {
                JSValue key, value;
                JSValueConst args[2];
                key = JS_UNDEFINED;
                value = JS_UNDEFINED;
                if (!JS_IsObject(item)) {
                    JS_ThrowTypeErrorNotAnObject(ctx);
                    goto fail1;
                }
                key = JS_GetPropertyUint32(ctx, item, 0);
                if (JS_IsException(key))
                    goto fail1;
                value = JS_GetPropertyUint32(ctx, item, 1);
                if (JS_IsException(value))
                    goto fail1;
                args[0] = key;
                args[1] = value;
                ret = JS_Call(ctx, adder, obj, 2, args);
                if (JS_IsException(ret)) {
                fail1:
                    JS_FreeValue(ctx, item);
                    JS_FreeValue(ctx, key);
                    JS_FreeValue(ctx, value);
                    goto fail;
                }
                JS_FreeValue(ctx, key);
                JS_FreeValue(ctx, value);
            }
            JS_FreeValue(ctx, ret);
            JS_FreeValue(ctx, item);
        }
        JS_FreeValue(ctx, next_method);
        JS_FreeValue(ctx, iter);
        JS_FreeValue(ctx, adder);
    }
    return obj;
 fail:
    if (JS_IsObject(iter)) {
        /* close the iterator object, preserving pending exception */
        JS_IteratorClose(ctx, iter, TRUE);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, adder);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}